

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::Extend(ON_PolyCurve *this,ON_Interval *domain)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  ON_Curve *pOVar5;
  double dVar6;
  double dVar7;
  ON_Interval local_110;
  ON_Interval local_100;
  undefined1 local_f0 [8];
  ON_Interval DesiredDom_1;
  double a_1;
  ON_Interval cdom_1;
  ON_Interval sdom_1;
  ON_Curve *seg_1;
  undefined1 auStack_a8 [7];
  bool chgd;
  double local_a0;
  ON_Interval local_98;
  ON_Interval local_88;
  undefined1 local_78 [8];
  ON_Interval DesiredDom;
  double a;
  ON_Interval cdom;
  ON_Interval sdom;
  ON_Curve *seg;
  byte local_21;
  ON_Interval *pOStack_20;
  bool changed;
  ON_Interval *domain_local;
  ON_PolyCurve *this_local;
  
  pOStack_20 = domain;
  domain_local = (ON_Interval *)this;
  uVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
  if (((uVar2 & 1) == 0) && (iVar3 = Count(this), 0 < iVar3)) {
    local_21 = 0;
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
    pdVar4 = ON_Interval::operator[]((ON_Interval *)&seg,0);
    dVar7 = *pdVar4;
    dVar6 = ON_Interval::operator[](pOStack_20,0);
    if (dVar6 < dVar7) {
      pOVar5 = SegmentCurve(this,0);
      if (pOVar5 == (ON_Curve *)0x0) {
        return false;
      }
      join_0x00001240_0x00001200_ = SegmentDomain(this,0);
      dVar7 = cdom._16_8_;
      (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
      cdom.m_t[0] = dVar7;
      dVar7 = ON_Interval::operator[](pOStack_20,0);
      dVar7 = ON_Interval::TransformParameterTo
                        ((ON_Interval *)(cdom.m_t + 1),(ON_Interval *)&a,dVar7);
      DesiredDom.m_t[1] = dVar7;
      pdVar4 = ON_Interval::operator[]((ON_Interval *)&a,1);
      dVar6 = *pdVar4;
      ON_Interval::ON_Interval((ON_Interval *)local_78,dVar7,dVar6);
      uVar2 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3d])(pOVar5,local_78);
      local_21 = (byte)uVar2 & 1;
      if ((uVar2 & 1) != 0) {
        (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
        local_88.m_t[1] = dVar6;
        bVar1 = ON_Interval::operator==(&local_88,(ON_Interval *)local_78);
        if (bVar1) {
          dVar7 = ON_Interval::operator[](pOStack_20,0);
          pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,0);
          *pdVar4 = dVar7;
        }
        else {
          (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
          local_98.m_t[1] = dVar6;
          pdVar4 = ON_Interval::operator[](&local_98,0);
          dVar7 = ON_Interval::TransformParameterTo
                            ((ON_Interval *)&a,(ON_Interval *)(cdom.m_t + 1),*pdVar4);
          pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,0);
          *pdVar4 = dVar7;
        }
      }
    }
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
    local_a0 = dVar6;
    pdVar4 = ON_Interval::operator[]((ON_Interval *)auStack_a8,1);
    dVar7 = *pdVar4;
    dVar6 = ON_Interval::operator[](pOStack_20,1);
    if (dVar7 < dVar6) {
      iVar3 = Count(this);
      pOVar5 = SegmentCurve(this,iVar3 + -1);
      if (pOVar5 == (ON_Curve *)0x0) {
        return false;
      }
      iVar3 = Count(this);
      join_0x00001240_0x00001200_ = SegmentDomain(this,iVar3 + -1);
      dVar7 = cdom_1._16_8_;
      (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
      cdom_1.m_t[0] = dVar7;
      dVar7 = ON_Interval::operator[](pOStack_20,1);
      DesiredDom_1.m_t[1] =
           ON_Interval::TransformParameterTo
                     ((ON_Interval *)(cdom_1.m_t + 1),(ON_Interval *)&a_1,dVar7);
      pdVar4 = ON_Interval::operator[]((ON_Interval *)&a_1,0);
      dVar7 = DesiredDom_1.m_t[1];
      ON_Interval::ON_Interval((ON_Interval *)local_f0,*pdVar4,DesiredDom_1.m_t[1]);
      uVar2 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3d])(pOVar5,local_f0);
      if ((uVar2 & 1) != 0) {
        (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
        local_100.m_t[1] = dVar7;
        bVar1 = ON_Interval::operator==(&local_100,(ON_Interval *)local_f0);
        if (bVar1) {
          dVar7 = ON_Interval::operator[](pOStack_20,1);
          iVar3 = Count(this);
          pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,iVar3);
          *pdVar4 = dVar7;
        }
        else {
          (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
          local_110.m_t[1] = dVar7;
          pdVar4 = ON_Interval::operator[](&local_110,1);
          dVar7 = ON_Interval::TransformParameterTo
                            ((ON_Interval *)&a_1,(ON_Interval *)(cdom_1.m_t + 1),*pdVar4);
          iVar3 = Count(this);
          pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,iVar3);
          *pdVar4 = dVar7;
        }
        local_21 = 1;
      }
    }
    if ((local_21 & 1) != 0) {
      ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
    }
    this_local._7_1_ = (bool)(local_21 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PolyCurve::Extend(
  const ON_Interval& domain
  )
 
{
  if (IsClosed() || Count() < 1) return false;
 
  bool changed = false;
  if (Domain()[0] > domain[0]){
    ON_Curve* seg = SegmentCurve(0);
    if (!seg) return false;
    ON_Interval sdom = SegmentDomain(0);
    ON_Interval cdom = seg->Domain();
    double a = sdom.TransformParameterTo(cdom, domain[0]);
    ON_Interval DesiredDom(a, cdom[1]);
    changed = seg->Extend(DesiredDom);
    if (changed) {
      if (seg->Domain() == DesiredDom)
        m_t[0] = domain[0];
      else
        m_t[0] = cdom.TransformParameterTo(sdom, seg->Domain()[0]);
    }
  }
  if (Domain()[1] < domain[1]){
    bool chgd = false;
    ON_Curve* seg = SegmentCurve(Count()-1);
    if (!seg) return false;
    ON_Interval sdom = SegmentDomain(Count()-1);
    ON_Interval cdom = seg->Domain();
    double a = sdom.TransformParameterTo(cdom, domain[1]);
    ON_Interval DesiredDom(cdom[0], a);
    chgd = seg->Extend(DesiredDom);
    if (chgd) {
      if (seg->Domain() == DesiredDom)
        m_t[Count()] = domain[1];
      else
        m_t[Count()] = cdom.TransformParameterTo(sdom, seg->Domain()[1]);
      changed = true;
    }
  }
 
  if (changed){
    DestroyCurveTree();
  }
 
  return changed;
}